

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O2

MPP_RET mpp_buffer_group_deinit(MppBufferGroupImpl *p)

{
  MppBufferService *this;
  MPP_RET MVar1;
  
  if (p == (MppBufferGroupImpl *)0x0) {
    _mpp_log_l(2,"mpp_buffer","found NULL pointer\n","mpp_buffer_group_deinit");
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    if (((byte)mpp_buffer_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_buffer","enter\n","mpp_buffer_group_deinit");
    }
    this = MppBufferService::get_instance();
    MppBufferService::put_group(this,"mpp_buffer_group_deinit",p);
    MVar1 = MPP_OK;
    if (((byte)mpp_buffer_debug & 1) != 0) {
      MVar1 = MPP_OK;
      _mpp_log_l(4,"mpp_buffer","leave\n","mpp_buffer_group_deinit");
    }
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_buffer_group_deinit(MppBufferGroupImpl *p)
{
    if (NULL == p) {
        mpp_err_f("found NULL pointer\n");
        return MPP_ERR_NULL_PTR;
    }

    MPP_BUF_FUNCTION_ENTER();

    MppBufferService::get_instance()->put_group(__FUNCTION__, p);

    MPP_BUF_FUNCTION_LEAVE();
    return MPP_OK;
}